

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRetF.c
# Opt level: O1

Aig_Man_t * Aig_ManRetimeFrontier(Aig_Man_t *p,int nStepsMax)

{
  ulong *puVar1;
  byte *pbVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  Aig_Obj_t *pObj;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  Aig_Man_t *pAVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRetF.c"
                  ,0x81,"Aig_Man_t *Aig_ManRetimeFrontier(Aig_Man_t *, int)");
  }
  Aig_TableClear(p);
  Aig_ManRetimeMark(p);
  iVar15 = p->nRegs;
  if (0 < iVar15) {
    iVar7 = 0;
    do {
      uVar12 = (p->nObjs[3] - iVar15) + iVar7;
      if (((((int)uVar12 < 0) || (p->vCos->nSize <= (int)uVar12)) ||
          (uVar14 = (p->nObjs[2] - iVar15) + iVar7, (int)uVar14 < 0)) ||
         (p->vCis->nSize <= (int)uVar14)) goto LAB_0063d5ef;
      puVar3 = (undefined8 *)p->vCos->pArray[uVar12];
      puVar4 = (undefined8 *)p->vCis->pArray[uVar14];
      puVar4[3] = puVar4[3] | 0x10;
      *puVar4 = puVar3;
      *puVar3 = puVar4;
      iVar7 = iVar7 + 1;
      iVar15 = p->nRegs;
    } while (iVar7 < iVar15);
  }
  iVar15 = 0;
  do {
    pVVar8 = p->vObjs;
    if (pVVar8->nSize < 1) {
      bVar5 = true;
    }
    else {
      lVar13 = 0;
      bVar5 = false;
      do {
        pObj = (Aig_Obj_t *)pVVar8->pArray[lVar13];
        bVar6 = bVar5;
        if (pObj != (Aig_Obj_t *)0x0) {
          uVar12 = (uint)*(ulong *)&pObj->field_0x18 & 7;
          if (((uVar12 != 4) && ((*(ulong *)&pObj->field_0x18 & 0x20) != 0)) &&
             (0xfffffffd < uVar12 - 7)) {
            pAVar9 = Aig_ObjReal_rec(pObj->pFanin0);
            pAVar10 = Aig_ObjReal_rec(pObj->pFanin1);
            if (((*(byte *)((long *)((ulong)pAVar9 & 0xfffffffffffffffe) + 3) & 0x10) != 0) &&
               ((*(byte *)((long *)((ulong)pAVar10 & 0xfffffffffffffffe) + 3) & 0x10) != 0)) {
              uVar12 = (uint)pAVar9 & 1;
              uVar16 = (ulong)(uVar12 & (uint)pAVar10);
              pAVar9 = Aig_And(p,(Aig_Obj_t *)
                                 ((ulong)uVar12 ^
                                 *(ulong *)(*(long *)((ulong)pAVar9 & 0xfffffffffffffffe) + 8)),
                               (Aig_Obj_t *)
                               ((ulong)((uint)pAVar10 & 1) ^
                               *(ulong *)(*(long *)((ulong)pAVar10 & 0xfffffffffffffffe) + 8)));
              pAVar9->field_0x18 = pAVar9->field_0x18 | 0x20;
              pAVar10 = Aig_ObjCreateCi(p);
              pAVar10->field_0x18 = pAVar10->field_0x18 | 0x10;
              pAVar9 = Aig_ObjCreateCo(p,(Aig_Obj_t *)((ulong)pAVar9 ^ uVar16));
              p->nRegs = p->nRegs + 1;
              (pAVar10->field_0).pNext = pAVar9;
              (pAVar9->field_0).pNext = pAVar10;
              Aig_ObjDisconnect(p,pObj);
              *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xfffffffffffffff8 | 4;
              p->nObjs[5] = p->nObjs[5] + -1;
              p->nObjs[4] = p->nObjs[4] + 1;
              bVar5 = false;
              Aig_ObjConnect(p,pObj,(Aig_Obj_t *)(uVar16 ^ (ulong)pAVar10),(Aig_Obj_t *)0x0);
              iVar15 = iVar15 + 1;
              bVar6 = true;
              if (nStepsMax <= iVar15) break;
            }
          }
        }
        bVar5 = bVar6;
        lVar13 = lVar13 + 1;
        pVVar8 = p->vObjs;
      } while (lVar13 < pVVar8->nSize);
      bVar5 = !bVar5;
    }
  } while (!bVar5);
  iVar15 = p->nRegs;
  if (0 < iVar15) {
    iVar7 = 0;
    do {
      uVar12 = (p->nObjs[3] - iVar15) + iVar7;
      if (((((int)uVar12 < 0) || (p->vCos->nSize <= (int)uVar12)) ||
          (uVar14 = (p->nObjs[2] - iVar15) + iVar7, (int)uVar14 < 0)) ||
         (p->vCis->nSize <= (int)uVar14)) {
LAB_0063d5ef:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar3 = (undefined8 *)p->vCos->pArray[uVar12];
      puVar4 = (undefined8 *)p->vCis->pArray[uVar14];
      puVar1 = puVar4 + 3;
      *puVar1 = *puVar1 & 0xffffffffffffffef;
      *puVar3 = 0;
      *puVar4 = 0;
      iVar7 = iVar7 + 1;
      iVar15 = p->nRegs;
    } while (iVar7 < iVar15);
  }
  pVVar8 = p->vObjs;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      if (pVVar8->pArray[lVar13] != (void *)0x0) {
        pbVar2 = (byte *)((long)pVVar8->pArray[lVar13] + 0x18);
        *pbVar2 = *pbVar2 & 0xdf;
      }
      lVar13 = lVar13 + 1;
      pVVar8 = p->vObjs;
    } while (lVar13 < pVVar8->nSize);
  }
  Aig_ManSeqCleanup(p);
  pAVar11 = Aig_ManDupOrdered(p);
  return pAVar11;
}

Assistant:

Aig_Man_t * Aig_ManRetimeFrontier( Aig_Man_t * p, int nStepsMax )
{
    Aig_Obj_t * pObj, * pObjNew, * pObjLo, * pObjLo0, * pObjLo1, * pObjLi, * pObjLi0, * pObjLi1;//, * pObjLi0_, * pObjLi1_, * pObjLi0__, * pObjLi1__;
    int i, Counter, fCompl, fChange;
    assert( Aig_ManRegNum(p) > 0 );
    // remove structural hashing table
    Aig_TableClear( p );
    // mark the retimable nodes
    Aig_ManRetimeMark( p );
    // mark the register outputs
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        pObjLo->fMarkA = 1;
        pObjLo->pNext = pObjLi;
        pObjLi->pNext = pObjLo;
    }
    // go through the nodes and find retimable ones
    Counter = 0;
    fChange = 1;
    while ( fChange )
    {
        fChange = 0;
        Aig_ManForEachNode( p, pObj, i )
        {
            if ( !pObj->fMarkB )
                continue;
            if ( Aig_ObjIsBuf(pObj) )
                continue;
            // get the real inputs of the node (skipping the buffers)
            pObjLo0 = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
            pObjLo1 = Aig_ObjReal_rec( Aig_ObjChild1(pObj) );
            if ( !Aig_Regular(pObjLo0)->fMarkA || !Aig_Regular(pObjLo1)->fMarkA )
                continue;
            // remember complemented attribute
            fCompl = Aig_IsComplement(pObjLo0) & Aig_IsComplement(pObjLo1);
            // get the register inputs
//            pObjLi0_ = Aig_Regular(pObjLo0)->pNext;
//            pObjLi1_ = Aig_Regular(pObjLo1)->pNext;
//            pObjLi0__ = Aig_ObjChild0(Aig_Regular(pObjLo0)->pNext);
//            pObjLi1__ = Aig_ObjChild0(Aig_Regular(pObjLo1)->pNext);
            pObjLi0 = Aig_NotCond( Aig_ObjChild0(Aig_Regular(pObjLo0)->pNext), Aig_IsComplement(pObjLo0) );
            pObjLi1 = Aig_NotCond( Aig_ObjChild0(Aig_Regular(pObjLo1)->pNext), Aig_IsComplement(pObjLo1) );
            // create new node
            pObjNew = Aig_And( p, pObjLi0, pObjLi1 );
            pObjNew->fMarkB = 1;
            // create new register
            pObjLo = Aig_ObjCreateCi(p);
            pObjLo->fMarkA = 1;
            pObjLi = Aig_ObjCreateCo( p, Aig_NotCond(pObjNew, fCompl) );
            p->nRegs++;
            pObjLo->pNext = pObjLi;
            pObjLi->pNext = pObjLo;
            // add the buffer
            Aig_ObjDisconnect( p, pObj );
            pObj->Type = AIG_OBJ_BUF;
            p->nObjs[AIG_OBJ_AND]--;
            p->nObjs[AIG_OBJ_BUF]++;
            Aig_ObjConnect( p, pObj, Aig_NotCond(pObjLo, fCompl), NULL );
            // create HAIG if defined
            // mark the change
            fChange = 1;
            // check the limit
            if ( ++Counter >= nStepsMax )
            {
                fChange = 0;
                break;
            }
        }
    }
    // clean the markings
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        pObjLo->fMarkA = 0;
        pObjLo->pNext = pObjLi->pNext = NULL;
    }
    Aig_ManForEachObj( p, pObj, i )
        pObj->fMarkB = 0;
    // remove useless registers
    Aig_ManSeqCleanup( p );
    // rehash the nodes
    return Aig_ManDupOrdered( p ); 
}